

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void nth_valueStepFunc(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  Mem *pRec;
  long lVar1;
  ushort uVar2;
  long *plVar3;
  long lVar4;
  sqlite3_value *psVar5;
  Mem *pMem;
  double dVar6;
  
  if ((pCtx->pMem->flags & 0x2000) == 0) {
    plVar3 = (long *)createAggContext(pCtx,0x10);
  }
  else {
    plVar3 = (long *)pCtx->pMem->z;
  }
  if (plVar3 != (long *)0x0) {
    pRec = apArg[1];
    uVar2 = pRec->flags;
    if ((uVar2 & 0xf) == 2) {
      applyNumericAffinity(pRec,0);
      uVar2 = pRec->flags;
    }
    if ("\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05"
        [uVar2 & 0x1f] == '\x02') {
      dVar6 = sqlite3VdbeRealValue(apArg[1]);
      lVar4 = (long)dVar6;
      if ((dVar6 != (double)lVar4) || (NAN(dVar6) || NAN((double)lVar4))) goto LAB_001ae2c4;
    }
    else {
      if ("\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05"
          [uVar2 & 0x1f] != '\x01') goto LAB_001ae2c4;
      lVar4 = sqlite3VdbeIntValue(apArg[1]);
    }
    if (lVar4 < 1) {
LAB_001ae2c4:
      pCtx->isError = 1;
      sqlite3VdbeMemSetStr
                (pCtx->pOut,"second argument to nth_value must be a positive integer",-1,'\x01',
                 (_func_void_void_ptr *)0xffffffffffffffff);
      return;
    }
    lVar1 = *plVar3;
    *plVar3 = lVar1 + 1;
    if (lVar4 == lVar1 + 1) {
      psVar5 = sqlite3_value_dup(*apArg);
      plVar3[1] = (long)psVar5;
      if (psVar5 == (sqlite3_value *)0x0) {
        sqlite3_result_error_nomem(pCtx);
        return;
      }
    }
  }
  return;
}

Assistant:

static void nth_valueStepFunc(
  sqlite3_context *pCtx, 
  int nArg,
  sqlite3_value **apArg
){
  struct NthValueCtx *p;
  p = (struct NthValueCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    i64 iVal;
    switch( sqlite3_value_numeric_type(apArg[1]) ){
      case SQLITE_INTEGER:
        iVal = sqlite3_value_int64(apArg[1]);
        break;
      case SQLITE_FLOAT: {
        double fVal = sqlite3_value_double(apArg[1]);
        if( ((i64)fVal)!=fVal ) goto error_out;
        iVal = (i64)fVal;
        break;
      }
      default:
        goto error_out;
    }
    if( iVal<=0 ) goto error_out;

    p->nStep++;
    if( iVal==p->nStep ){
      p->pValue = sqlite3_value_dup(apArg[0]);
      if( !p->pValue ){
        sqlite3_result_error_nomem(pCtx);
      }
    }
  }
  UNUSED_PARAMETER(nArg);
  UNUSED_PARAMETER(apArg);
  return;

 error_out:
  sqlite3_result_error(
      pCtx, "second argument to nth_value must be a positive integer", -1
  );
}